

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O2

void Tokenizer::trim(string *string)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::
  regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
            (&local_30,string,&WHITESPACE_REGEX_abi_cxx11_,"$1",0);
  std::__cxx11::string::operator=((string *)string,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Tokenizer::trim(std::string& string)
{
	string = std::regex_replace(string, WHITESPACE_REGEX, "$1");
}